

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LanguageDialect.cpp
# Opt level: O1

string * __thiscall psy::C::to_string_abi_cxx11_(string *__return_storage_ptr__,C *this,Std std)

{
  ostream *poVar1;
  char *pcVar2;
  char *__end;
  char *pcVar3;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "c89";
    pcVar3 = "";
    break;
  case 1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "c99";
    pcVar3 = "";
    break;
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "c11";
    pcVar3 = "";
    break;
  case 3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "c17";
    pcVar3 = "";
    break;
  default:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,"[ASSERT] at ",0xc)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&::std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/LanguageDialect.cpp"
               ,0x60);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&::std::cout,":",1);
    poVar1 = (ostream *)::std::ostream::operator<<((ostream *)&::std::cout,0x4f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    pcVar3 = "";
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar1,"",0);
    ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    ::std::ostream::put((char)poVar1);
    ::std::ostream::flush();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = pcVar3;
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(LanguageDialect::Std std)
{
    switch (std) {
        case LanguageDialect::Std::C89_90:
            return "c89";

        case LanguageDialect::Std::C99:
            return "c99";

        case LanguageDialect::Std::C11:
            return "c11";

        case LanguageDialect::Std::C17_18:
            return "c17";

        default:
            PSY_ASSERT_3(false, return "", "");
    }
}